

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

bool __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::MergePartialFromCodedStream
          (UniDirectionalLSTMLayerParams *this,CodedInputStream *input)

{
  uint32 tag_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  ActivationParams *value;
  LSTMParams *value_00;
  LSTMWeightParams *value_01;
  bool local_8a;
  bool local_89;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  UniDirectionalLSTMLayerParams *this_local;
  bool local_3d;
  uint32 local_3c;
  bool local_35;
  uint32 tag_1;
  undefined4 uStack_30;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  do {
    kMax1ByteVarint = 0x3fff;
    tag_2 = 0;
    _first_byte_or_zero = input;
    if (input->buffer_ < input->buffer_end_) {
      tag_2 = (uint32)*input->buffer_;
      if ((char)*input->buffer_ < '\x01') {
        if ((input->buffer_end_ <= input->buffer_ + 1) ||
           ((*input->buffer_ & (input->buffer_[1] ^ 0xff)) < 0x80)) goto LAB_00284b0a;
        uStack_30 = 0x3fff;
        tag_1 = (uint)input->buffer_[1] * 0x80 + (*input->buffer_ - 0x80);
        google::protobuf::io::CodedInputStream::Advance(input,2);
        local_8a = 0x3ffe < kMax1ByteVarint || tag_1 <= kMax1ByteVarint;
        local_35 = local_8a;
        pVar4 = std::make_pair<unsigned_int&,bool&>(&tag_1,&local_35);
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
      else {
        local_24 = 0x7f;
        kMax2ByteVarint = (uint32)*input->buffer_;
        google::protobuf::io::CodedInputStream::Advance(input,1);
        local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
        tag_3._3_1_ = local_89;
        pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
    }
    else {
LAB_00284b0a:
      local_3c = google::protobuf::io::CodedInputStream::ReadTagFallback(input,tag_2);
      local_3d = local_3c - 1 < kMax1ByteVarint;
      pVar4 = std::make_pair<unsigned_int_const&,bool>(&local_3c,&local_3d);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    tag_00 = local_10;
    if ((uStack_c & 1) == 0) {
LAB_00284d3f:
      if ((tag_00 == 0) ||
         (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(tag_00),
         WVar3 == WIRETYPE_END_GROUP)) {
        return true;
      }
      bVar1 = google::protobuf::internal::WireFormatLite::SkipField(input,tag_00);
    }
    else {
      iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
      if (iVar2 == 1) {
        if ((tag_00 & 0xff) != 8) goto LAB_00284d3f;
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          (input,&this->inputvectorsize_);
      }
      else if (iVar2 == 2) {
        if ((tag_00 & 0xff) != 0x10) goto LAB_00284d3f;
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          (input,&this->outputvectorsize_);
      }
      else if (iVar2 == 10) {
        if ((tag_00 & 0xff) != 0x52) goto LAB_00284d3f;
        value = add_activations(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::ActivationParams>(input,value);
      }
      else if (iVar2 == 0xf) {
        if ((tag_00 & 0xff) != 0x7a) goto LAB_00284d3f;
        value_00 = mutable_params(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::LSTMParams>(input,value_00);
      }
      else if (iVar2 == 0x14) {
        if ((tag_00 & 0xff) != 0xa2) goto LAB_00284d3f;
        value_01 = mutable_weightparams(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::LSTMWeightParams>(input,value_01);
      }
      else {
        if ((iVar2 != 100) || ((tag_00 & 0xff) != 0x20)) goto LAB_00284d3f;
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (input,&this->reverseinput_);
      }
    }
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool UniDirectionalLSTMLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.UniDirectionalLSTMLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 inputVectorSize = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &inputvectorsize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 outputVectorSize = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &outputvectorsize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.ActivationParams activations = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_activations()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.LSTMParams params = 15;
      case 15: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(122u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_params()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.LSTMWeightParams weightParams = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_weightparams()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool reverseInput = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(800u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &reverseinput_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.UniDirectionalLSTMLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.UniDirectionalLSTMLayerParams)
  return false;
#undef DO_
}